

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentParserHelper.cxx
# Opt level: O1

void __thiscall cmCommandArgumentParserHelper::CleanupParser(cmCommandArgumentParserHelper *this)

{
  pointer ppcVar1;
  pointer ppcVar2;
  pointer ppcVar3;
  
  ppcVar1 = (this->Variables).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppcVar3 = (this->Variables).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppcVar3 != ppcVar1; ppcVar3 = ppcVar3 + 1) {
    if (*ppcVar3 != (char *)0x0) {
      operator_delete__(*ppcVar3);
    }
  }
  ppcVar3 = (this->Variables).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppcVar1 = (this->Variables).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if ((ppcVar3 != ppcVar1) &&
     (ppcVar2 = (this->Variables).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                super__Vector_impl_data._M_finish,
     ppcVar3 = (pointer)((long)ppcVar3 + ((long)ppcVar2 - (long)ppcVar1)), ppcVar2 != ppcVar3)) {
    (this->Variables).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppcVar3;
  }
  return;
}

Assistant:

void cmCommandArgumentParserHelper::CleanupParser()
{
  for (char* var : this->Variables) {
    delete[] var;
  }
  this->Variables.erase(this->Variables.begin(), this->Variables.end());
}